

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O1

bool __thiscall TileWire::alternativeTile(TileWire *this)

{
  State SVar1;
  Board *pBVar2;
  
  if (this->_type == CROSSOVER) {
    this->_type = JUNCTION;
    SVar1 = LOW;
  }
  else {
    if (this->_type != JUNCTION) {
      return false;
    }
    this->_type = CROSSOVER;
    SVar1 = this->_state1;
  }
  this->_state2 = SVar1;
  (*(this->super_Tile)._vptr_Tile[8])(this,0,0);
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  pBVar2->changesMade = true;
  return false;
}

Assistant:

bool TileWire::alternativeTile() {
    if (_type == JUNCTION) {
        _type = CROSSOVER;
        _state2 = _state1;
        addUpdate();
        getBoardPtr()->changesMade = true;
    } else if (_type == CROSSOVER) {
        _type = JUNCTION;
        _state2 = LOW;
        addUpdate();
        getBoardPtr()->changesMade = true;
    }
    return false;
}